

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O3

void __thiscall QVariantAnimationPrivate::~QVariantAnimationPrivate(QVariantAnimationPrivate *this)

{
  ~QVariantAnimationPrivate(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

void QVariantAnimationPrivate::convertValues(int t)
{
    auto type = QMetaType(t);
    //this ensures that all the keyValues are of type t
    for (int i = 0; i < keyValues.size(); ++i) {
        QVariantAnimation::KeyValue &pair = keyValues[i];
        pair.second.convert(type);
    }
    //we also need update to the current interval if needed
    currentInterval.start.second.convert(type);
    currentInterval.end.second.convert(type);

    //... and the interpolator
    updateInterpolator();
}